

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImVec2 *ref_pos_00;
  ImGuiPopupPositionPolicy policy;
  float fVar6;
  ImVec2 ref_pos;
  ImRect r_avoid;
  ImRect r_outer;
  ImVec2 local_48;
  float local_3c;
  ImRect local_38;
  ImRect local_20;
  
  pIVar5 = GImGui;
  ref_pos_00 = &local_48;
  local_20 = GetPopupAllowedExtentRect(window);
  uVar2 = window->Flags;
  if ((uVar2 >> 0x1c & 1) == 0) {
    if ((uVar2 >> 0x1a & 1) == 0) {
      if ((uVar2 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x24cb,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      local_3c = (pIVar5->Style).MouseCursorScale;
      local_48 = NavCalcPreferredRefPos();
      if (((pIVar5->NavDisableHighlight == false) && (pIVar5->NavDisableMouseHover == true)) &&
         (((pIVar5->IO).ConfigFlags & 4) == 0)) {
        local_38.Max.x = local_48.x + 16.0;
        fVar6 = 8.0;
      }
      else {
        fVar6 = local_3c * 24.0;
        local_38.Max.x = fVar6 + local_48.x;
      }
      local_38.Min.y = local_48.y + -8.0;
      local_38.Min.x = local_48.x + -16.0;
      local_38.Max.y = fVar6 + local_48.y;
      policy = ImGuiPopupPositionPolicy_Tooltip;
      goto LAB_00137634;
    }
    fVar6 = (window->Pos).x;
    fVar1 = (window->Pos).y;
    local_38.Min.y = fVar1 + -1.0;
    local_38.Min.x = fVar6 + -1.0;
    local_38.Max.y = fVar1 + 1.0;
    local_38.Max.x = fVar6 + 1.0;
  }
  else {
    pIVar3 = window->ParentWindow;
    fVar6 = (pIVar5->Style).ItemInnerSpacing.x;
    if ((pIVar3->DC).MenuBarAppending == true) {
      local_38.Min.y = (pIVar3->ClipRect).Min.y;
      local_38.Max.y = (pIVar3->ClipRect).Max.y;
      local_38.Max.x = 3.4028235e+38;
      local_38.Min.x = -3.4028235e+38;
    }
    else {
      fVar1 = (pIVar3->Pos).x;
      local_38.Min.x = fVar6 + fVar1;
      local_38.Max.x = ((fVar1 + (pIVar3->Size).x) - fVar6) - (pIVar3->ScrollbarSizes).x;
      local_38.Max.y = 3.4028235e+38;
      local_38.Min.y = -3.4028235e+38;
    }
  }
  ref_pos_00 = &window->Pos;
  policy = ImGuiPopupPositionPolicy_Default;
LAB_00137634:
  IVar4 = FindBestWindowPosForPopupEx
                    (ref_pos_00,&window->Size,&window->AutoPosLastDirection,&local_20,&local_38,
                     policy);
  return IVar4;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetPopupAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        ImGuiWindow* parent_window = window->ParentWindow;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}